

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::base64_encode(string *__return_storage_ptr__,string *in)

{
  pointer pcVar1;
  char cVar2;
  pointer pcVar3;
  uint uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar3 = (in->_M_dataplus)._M_p;
  pcVar1 = pcVar3 + in->_M_string_length;
  uVar4 = 0xfffffffa;
  while( true ) {
    cVar2 = (char)__return_storage_ptr__;
    if (pcVar3 == pcVar1) break;
    for (uVar4 = uVar4 + 8; -1 < (int)uVar4; uVar4 = uVar4 - 6) {
      std::__cxx11::string::push_back(cVar2);
    }
    pcVar3 = pcVar3 + 1;
  }
  if (0xfffffffa < uVar4) {
    std::__cxx11::string::push_back(cVar2);
  }
  while ((__return_storage_ptr__->_M_string_length & 3) != 0) {
    std::__cxx11::string::push_back(cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string base64_encode(const std::string& in) {
            static const auto lookup =
                "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

            std::string out;
            out.reserve(in.size());

            int val = 0;
            int valb = -6;

            for (auto c : in) {
                val = (val << 8) + static_cast<uint8_t>(c);
                valb += 8;
                while (valb >= 0) {
                    out.push_back(lookup[(val >> valb) & 0x3F]);
                    valb -= 6;
                }
            }

            if (valb > -6) { out.push_back(lookup[((val << 8) >> (valb + 8)) & 0x3F]); }

            while (out.size() % 4) {
                out.push_back('=');
            }

            return out;
        }